

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsettings.cpp
# Opt level: O1

QString * __thiscall
QConfFileSettingsPrivate::fileName(QString *__return_storage_ptr__,QConfFileSettingsPrivate *this)

{
  QConfFile *pQVar1;
  Data *pDVar2;
  
  if ((this->confFiles).d.size != 0) {
    pQVar1 = *(this->confFiles).d.ptr;
    pDVar2 = (pQVar1->name).d.d;
    (__return_storage_ptr__->d).d = pDVar2;
    (__return_storage_ptr__->d).ptr = (pQVar1->name).d.ptr;
    (__return_storage_ptr__->d).size = (pQVar1->name).d.size;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  return __return_storage_ptr__;
}

Assistant:

QString QConfFileSettingsPrivate::fileName() const
{
    if (confFiles.isEmpty())
        return QString();

    // Note: First config file is always the most specific.
    return confFiles.at(0)->name;
}